

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_sprite.cpp
# Opt level: O2

void __thiscall GLSprite::Draw(GLSprite *this,int pass)

{
  secplane_t *psVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  BYTE BVar6;
  ushort uVar7;
  FRenderStyle style;
  lightlist_t *plVar8;
  sector_t *sec;
  bool bVar9;
  bool bVar10;
  PalEntry PVar11;
  bool bVar12;
  bool bVar13;
  byte bVar14;
  bool bVar15;
  uint uVar17;
  TArray<lightlist_t,_lightlist_t> *pTVar18;
  int iVar19;
  ushort uVar20;
  int rellight;
  ulong uVar21;
  long lVar22;
  particle_t *particle;
  secplane_t *top;
  AActor *pAVar23;
  uint lightlevel;
  secplane_t *bottom;
  ulong uVar24;
  float fVar25;
  float fVar26;
  secplane_t topp;
  secplane_t bottomp;
  ulong local_f8;
  FColormap thiscm;
  float fStack_d8;
  float fStack_d4;
  float local_d0;
  undefined8 local_cc;
  undefined8 local_c4;
  float local_bc;
  FQuadDrawer qd;
  secplane_t local_88;
  secplane_t local_58;
  int iVar16;
  
  if ((pass & 0xfffffffdU) == 1) {
    return;
  }
  rellight = gl_weaponlight.Value * extralight;
  bVar13 = false;
  if (this->fullbright != false) {
    rellight = 0;
  }
  if (pass == 4) {
    if ((this->RenderStyle).field_0.BlendOp != '\x01') {
      gl_RenderState.mBrightmapEnabled = false;
    }
    style = this->RenderStyle;
    if (((this->trans <= 0.9999999) ||
        ((this->actor != (AActor *)0x0 & this->fullbright &
         (gl_fixedcolormap == 0 && gl_usecolorblending.Value)) != 1)) ||
       (this->gltexture == (FMaterial *)0x0)) {
      bVar12 = false;
    }
    else {
      bVar12 = FMaterial::GetTransparent(this->gltexture);
      bVar12 = !bVar12;
    }
    bVar13 = false;
    gl_SetRenderStyle(style,false,bVar12);
    gl_RenderState.mAlphaThreshold = -0.001;
    if (this->hw_styleflags != '\x02') {
      gl_RenderState.mAlphaThreshold = gl_mask_sprite_threshold.Value + -0.001;
    }
    BVar6 = (this->RenderStyle).field_0.BlendOp;
    if (BVar6 == '\x01') {
      bVar13 = (this->RenderStyle).field_0.DestAlpha == '\x01';
    }
    else if (BVar6 == '\b') {
      bVar13 = gl_isBlack((PalEntry)(this->Colormap).FadeColor.field_0.field_0);
      if (bVar13) {
        gl_RenderState.mColor.vec[3] = 0.44;
      }
      else {
        fVar25 = (float)ViewPos.X - this->x;
        fVar26 = (float)ViewPos.Y - this->y;
        bVar14 = (this->Colormap).FadeColor.field_0.field_0.a;
        if (bVar14 == 0) {
          iVar19 = 0xff - this->lightlevel;
          if (0xfe < iVar19) {
            iVar19 = 0xff;
          }
          iVar16 = 0x3c;
          if (0x3c < iVar19) {
            iVar16 = iVar19;
          }
          bVar14 = (byte)iVar16;
          (this->Colormap).FadeColor.field_0.field_0.a = bVar14;
        }
        fVar25 = expf(SQRT(fVar26 * fVar26 + fVar25 * fVar25) * 1.6e-05 * (float)(int)-(uint)bVar14)
        ;
        gl_RenderState.mColor.vec[3] = fVar25 * 0.44 + 0.022;
      }
      gl_RenderState.mAlphaThreshold = gl_mask_sprite_threshold.Value + -0.001;
      gl_RenderState.mDesaturation = (this->Colormap).desaturation;
      gl_RenderState.mColor.vec[0] = 0.2;
      gl_RenderState.mColor.vec[1] = 0.2;
      gl_RenderState.mColor.vec[2] = 0.2;
      bVar13 = true;
    }
  }
  if ((this->RenderStyle).field_0.BlendOp != '\b') {
    if (((gl_lights.Value == true) && (GLRenderer->mLightCount != 0)) &&
       ((gl_fixedcolormap == 0 && (this->fullbright == false)))) {
      particle = (particle_t *)0x0;
      pAVar23 = (AActor *)0x0;
      if (gl_light_sprites.Value != false) {
        pAVar23 = this->actor;
      }
      if (gl_light_particles.Value != false) {
        particle = this->particle;
      }
      gl_SetDynSpriteLight(pAVar23,particle);
    }
    gl_SetColor(this->lightlevel,rellight,&this->Colormap,this->trans,false);
  }
  gl_RenderState.mObjectColor.field_0 =
       (anon_union_4_2_12391d7c_for_PalEntry_0)
       *(anon_union_4_2_12391d7c_for_PalEntry_0 *)&(this->ThingColor).field_0.field_0;
  bVar12 = gl_isBlack((PalEntry)(this->Colormap).FadeColor.field_0.field_0);
  if (bVar12) {
    this->foglevel = (BYTE)this->lightlevel;
  }
  if (((this->RenderStyle).field_0.Flags & 0x40) != 0) {
    (this->Colormap).FadeColor.field_0.d = 0;
    bVar13 = true;
  }
  if (((this->RenderStyle).field_0.BlendOp & 0xfe) == 2) {
    if (this->modelframe == (FSpriteModelFrame *)0x0) {
      bVar12 = gl_isBlack((PalEntry)(this->Colormap).FadeColor.field_0.field_0);
      if (!bVar12) {
        gl_RenderState.mAlphaThreshold = 0.0;
        gl_RenderState.mFogEnabled = false;
        gl_RenderState.mFogColor.field_0 =
             (anon_union_4_2_12391d7c_for_PalEntry_0)
             (anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0)0x0;
        gl_RenderState.mLightParms[2] = -0.0;
        bVar12 = true;
        goto LAB_003f0d0e;
      }
    }
    else {
      (this->RenderStyle).field_0.BlendOp = '\x04';
    }
  }
  gl_SetFog((uint)this->foglevel,rellight,&this->Colormap,bVar13);
  bVar12 = false;
LAB_003f0d0e:
  if (this->gltexture == (FMaterial *)0x0) {
    if (this->modelframe == (FSpriteModelFrame *)0x0) {
      gl_RenderState.mTextureEnabled = false;
    }
  }
  else {
    FRenderState::SetMaterial
              (&gl_RenderState,this->gltexture,3,this->translation,this->OverrideShader,
               (bool)(((this->RenderStyle).field_0.Flags & 4) >> 2));
  }
  pTVar18 = this->lightlist;
  if (pTVar18 == (TArray<lightlist_t,_lightlist_t> *)0x0) {
    uVar21 = 1;
  }
  else {
    uVar21 = (ulong)pTVar18->Count;
  }
  bVar9 = this->topclip != 1e+19;
  bVar10 = this->bottomclip != -1e+19;
  bVar15 = bVar10 || (bVar9 || pTVar18 != (TArray<lightlist_t,_lightlist_t> *)0x0);
  if (bVar10 || (bVar9 || pTVar18 != (TArray<lightlist_t,_lightlist_t> *)0x0)) {
    FRenderState::EnableSplit(&gl_RenderState,true);
    uVar4 = this->topclip;
    uVar5 = this->bottomclip;
    local_88.D = (double)(float)uVar4;
    local_58.D = (double)(float)uVar5;
  }
  else {
    local_88.D = 9.999999980506448e+18;
    local_58.D = -9.999999980506448e+18;
  }
  local_58.normal.X = 0.0;
  local_58.normal.Y = 0.0;
  local_58.normal.Z = -1.0;
  local_58.negiC = 0.0;
  local_88.normal.X = 0.0;
  local_88.normal.Y = 0.0;
  local_88.normal.Z = -1.0;
  local_88.negiC = 0.0;
  uVar24 = 0;
  for (lVar22 = 0; uVar21 * 0x50 != lVar22; lVar22 = lVar22 + 0x50) {
    pTVar18 = this->lightlist;
    if (pTVar18 == (TArray<lightlist_t,_lightlist_t> *)0x0) {
      if (bVar15) {
        FRenderState::SetSplitPlanes(&gl_RenderState,&local_88,&local_58);
      }
    }
    else {
      plVar8 = pTVar18->Array;
      top = (secplane_t *)((long)&(plVar8->plane).normal.X + lVar22);
      if (lVar22 == 0) {
        top = &local_88;
      }
      psVar1 = (secplane_t *)((long)&plVar8[1].plane.normal.X + lVar22);
      bottom = psVar1;
      if (uVar24 == pTVar18->Count - 1) {
        bottom = &local_58;
      }
      if (psVar1[-1].negiC == 0.0) {
        lightlevel = this->lightlevel;
      }
      else {
        uVar7 = **(ushort **)((long)&plVar8->p_lightlevel + lVar22);
        uVar20 = uVar7;
        if (0xfe < uVar7) {
          uVar20 = 0xff;
        }
        if ((short)uVar7 < 1) {
          uVar20 = 0;
        }
        lightlevel = (uint)uVar20;
      }
      pAVar23 = this->actor;
      uVar17 = lightlevel;
      if (pAVar23 != (AActor *)0x0) {
        sec = pAVar23->Sector;
        AActor::InterpolatedPosition((DVector3 *)&thiscm,pAVar23,r_TicFracF);
        uVar17 = gl_CheckSpriteGlow(sec,lightlevel,(DVector3 *)&thiscm);
        uVar17 = uVar17 & 0xff;
        pTVar18 = this->lightlist;
      }
      thiscm.FadeColor.field_0 =
           (anon_union_4_2_12391d7c_for_PalEntry_0)
           *(anon_union_4_2_12391d7c_for_PalEntry_0 *)&(this->Colormap).FadeColor.field_0.field_0;
      FColormap::CopyFrom3DLight
                (&thiscm,(lightlist_t *)((long)&(pTVar18->Array->plane).normal.X + lVar22));
      PVar11 = thiscm.LightColor;
      if (glset.nocoloredspritelighting == true) {
        thiscm.LightColor.field_0.field_0.g =
             (BYTE)((ushort)(((ushort)((ushort)thiscm.LightColor.field_0.field_0.b +
                                      (ushort)thiscm.LightColor.field_0.field_0.g +
                                      (ushort)thiscm.LightColor.field_0.field_0.r) / 3) * 2 + 0xff)
                   / 3);
        thiscm.LightColor.field_0.field_0.b = thiscm.LightColor.field_0.field_0.g;
        thiscm.LightColor.field_0.field_0.a = PVar11.field_0._3_1_;
        thiscm.LightColor.field_0.field_0.r = thiscm.LightColor.field_0.field_0.g;
      }
      gl_SetColor(uVar17,rellight,&thiscm,this->trans,false);
      if (!bVar12) {
        gl_SetFog(lightlevel,rellight,&thiscm,bVar13);
      }
      FRenderState::SetSplitPlanes(&gl_RenderState,top,bottom);
      local_f8 = uVar24;
    }
    if (this->modelframe == (FSpriteModelFrame *)0x0) {
      FRenderState::Apply(&gl_RenderState);
      if (((this->actor->renderflags).Value & 0x7000) != 0x2000) {
        CalculateVertices(this,(FVector3 *)&thiscm);
        local_f8 = (ulong)(uint)thiscm.LightColor.field_0;
      }
      FQuadDrawer::FQuadDrawer(&qd);
      fVar25 = this->ul;
      fVar26 = this->vt;
      (qd.p)->x = (float)local_f8;
      (qd.p)->z = (float)thiscm.FadeColor.field_0;
      (qd.p)->y = (float)thiscm.desaturation;
      (qd.p)->u = fVar25;
      (qd.p)->v = fVar26;
      fVar2 = this->ur;
      qd.p[1].x = (float)thiscm.blendfactor;
      qd.p[1].z = fStack_d8;
      qd.p[1].y = fStack_d4;
      qd.p[1].u = fVar2;
      fVar3 = this->vb;
      qd.p[1].v = fVar26;
      qd.p[2].x = local_d0;
      qd.p[2].z = (float)local_cc;
      qd.p[2].y = (float)((ulong)local_cc >> 0x20);
      qd.p[2].u = fVar25;
      qd.p[2].v = fVar3;
      qd.p[3].x = (float)local_c4;
      qd.p[3].z = (float)((ulong)local_c4 >> 0x20);
      qd.p[3].y = local_bc;
      qd.p[3].u = fVar2;
      qd.p[3].v = fVar3;
      FQuadDrawer::Render(&qd,5);
      if (bVar12) {
        gl_SetFog((uint)this->foglevel,rellight,&this->Colormap,bVar13);
        gl_RenderState.mColormapState = 0x10000000;
        if (gl_direct_state_change.Value == false) {
          gl_RenderState.mBlendEquation = 0x8006;
        }
        else {
          (*_ptrc_glBlendEquation)(0x8006);
        }
        if ((gl_direct_state_change.Value & 1U) == 0) {
          gl_RenderState.mSrcBlend = 0x302;
          gl_RenderState.mDstBlend = 0x303;
        }
        else {
          (*_ptrc_glBlendFunc)(0x302,0x303);
        }
        FRenderState::Apply(&gl_RenderState);
        FQuadDrawer::Render(&qd,5);
        gl_RenderState.mColormapState = 0;
      }
    }
    else {
      gl_RenderModel(this);
    }
    uVar24 = uVar24 + 1;
  }
  if (bVar15) {
    FRenderState::EnableSplit(&gl_RenderState,false);
  }
  if (pass == 4) {
    gl_RenderState.mBrightmapEnabled = true;
    if (gl_direct_state_change.Value == false) {
      gl_RenderState.mSrcBlend = 0x302;
      gl_RenderState.mDstBlend = 0x303;
    }
    else {
      (*_ptrc_glBlendFunc)(0x302,0x303);
    }
    if ((gl_direct_state_change.Value & 1U) == 0) {
      gl_RenderState.mBlendEquation = 0x8006;
    }
    else {
      (*_ptrc_glBlendEquation)(0x8006);
    }
    gl_RenderState.mTextureMode = 0;
  }
  gl_RenderState.mDynColor.vec[2] = 0.0;
  gl_RenderState.mDynColor.vec[3] = 0.0;
  gl_RenderState.mDynColor.vec[0] = 0.0;
  gl_RenderState.mDynColor.vec[1] = 0.0;
  gl_RenderState.mObjectColor = (PalEntry)0xffffffff;
  gl_RenderState.mTextureEnabled = true;
  return;
}

Assistant:

void GLSprite::Draw(int pass)
{
	if (pass == GLPASS_DECALS || pass == GLPASS_LIGHTSONLY) return;

	bool additivefog = false;
	bool foglayer = false;
	int rel = fullbright? 0 : getExtraLight();

	if (pass==GLPASS_TRANSLUCENT)
	{
		// The translucent pass requires special setup for the various modes.

		// for special render styles brightmaps would not look good - especially for subtractive.
		if (RenderStyle.BlendOp != STYLEOP_Add)
		{
			gl_RenderState.EnableBrightmap(false);
		}

		gl_SetRenderStyle(RenderStyle, false, 
			// The rest of the needed checks are done inside gl_SetRenderStyle
			trans > 1.f - FLT_EPSILON && gl_usecolorblending && gl_fixedcolormap == CM_DEFAULT && actor && 
			fullbright && gltexture && !gltexture->GetTransparent());

		if (hw_styleflags == STYLEHW_NoAlphaTest)
		{
			gl_RenderState.AlphaFunc(GL_GEQUAL, 0.f);
		}
		else
		{
			gl_RenderState.AlphaFunc(GL_GEQUAL, gl_mask_sprite_threshold);
		}

		if (RenderStyle.BlendOp == STYLEOP_Shadow)
		{
			float fuzzalpha=0.44f;
			float minalpha=0.1f;

			// fog + fuzz don't work well without some fiddling with the alpha value!
			if (!gl_isBlack(Colormap.FadeColor))
			{
				float dist=Dist2(ViewPos.X, ViewPos.Y, x,y);

				if (!Colormap.FadeColor.a) Colormap.FadeColor.a=clamp<int>(255-lightlevel,60,255);

				// this value was determined by trial and error and is scale dependent!
				float factor=0.05f+exp(-Colormap.FadeColor.a*dist/62500.f);
				fuzzalpha*=factor;
				minalpha*=factor;
			}

			gl_RenderState.AlphaFunc(GL_GEQUAL, gl_mask_sprite_threshold);
			gl_RenderState.SetColor(0.2f,0.2f,0.2f,fuzzalpha, Colormap.desaturation);
			additivefog = true;
		}
		else if (RenderStyle.BlendOp == STYLEOP_Add && RenderStyle.DestAlpha == STYLEALPHA_One)
		{
			additivefog = true;
		}
	}
	if (RenderStyle.BlendOp!=STYLEOP_Shadow)
	{
		if (gl_lights && GLRenderer->mLightCount && !gl_fixedcolormap && !fullbright)
		{
			gl_SetDynSpriteLight(gl_light_sprites ? actor : NULL, gl_light_particles ? particle : NULL);
		}
		gl_SetColor(lightlevel, rel, Colormap, trans);
	}
	gl_RenderState.SetObjectColor(ThingColor);

	if (gl_isBlack(Colormap.FadeColor)) foglevel=lightlevel;

	if (RenderStyle.Flags & STYLEF_FadeToBlack) 
	{
		Colormap.FadeColor=0;
		additivefog = true;
	}

	if (RenderStyle.BlendOp == STYLEOP_RevSub || RenderStyle.BlendOp == STYLEOP_Sub)
	{
		if (!modelframe)
		{
			// non-black fog with subtractive style needs special treatment
			if (!gl_isBlack(Colormap.FadeColor))
			{
				foglayer = true;
				// Due to the two-layer approach we need to force an alpha test that lets everything pass
				gl_RenderState.AlphaFunc(GL_GREATER, 0);
			}
		}
		else RenderStyle.BlendOp = STYLEOP_Fuzz;	// subtractive with models is not going to work.
	}

	if (!foglayer) gl_SetFog(foglevel, rel, &Colormap, additivefog);
	else
	{
		gl_RenderState.EnableFog(false);
		gl_RenderState.SetFog(0, 0);
	}

	if (gltexture) gl_RenderState.SetMaterial(gltexture, CLAMP_XY, translation, OverrideShader, !!(RenderStyle.Flags & STYLEF_RedIsAlpha));
	else if (!modelframe) gl_RenderState.EnableTexture(false);

		//gl_SetColor(lightlevel, rel, Colormap, trans);

	unsigned int iter = lightlist? lightlist->Size() : 1;
	bool clipping = false;
	if (lightlist || topclip != LARGE_VALUE || bottomclip != -LARGE_VALUE)
	{
		clipping = true;
		gl_RenderState.EnableSplit(true);
	}

	secplane_t bottomp = { { 0, 0, -1. }, bottomclip };
	secplane_t topp = { { 0, 0, -1. }, topclip };
	for (unsigned i = 0; i < iter; i++)
	{
		if (lightlist)
		{
			// set up the light slice
			secplane_t *topplane = i == 0 ? &topp : &(*lightlist)[i].plane;
			secplane_t *lowplane = i == (*lightlist).Size() - 1 ? &bottomp : &(*lightlist)[i + 1].plane;

			int thislight = (*lightlist)[i].caster != NULL ? gl_ClampLight(*(*lightlist)[i].p_lightlevel) : lightlevel;
			int thisll = actor == nullptr? thislight : (uint8_t)gl_CheckSpriteGlow(actor->Sector, thislight, actor->InterpolatedPosition(r_TicFracF));

			FColormap thiscm;
			thiscm.FadeColor = Colormap.FadeColor;
			thiscm.CopyFrom3DLight(&(*lightlist)[i]);
			if (glset.nocoloredspritelighting)
			{
				thiscm.Decolorize();
			}

			gl_SetColor(thisll, rel, thiscm, trans);
			if (!foglayer)
			{
				gl_SetFog(thislight, rel, &thiscm, additivefog);
			}
			gl_RenderState.SetSplitPlanes(*topplane, *lowplane);
		}
		else if (clipping)
		{
			gl_RenderState.SetSplitPlanes(topp, bottomp);
		}

		if (!modelframe)
		{
			gl_RenderState.Apply();

			FVector3 v[4];
			if ((actor->renderflags & RF_SPRITETYPEMASK) == RF_FLATSPRITE)
			{
			}
			else
			{
				CalculateVertices(v);
			}


			FQuadDrawer qd;
			qd.Set(0, v[0][0], v[0][1], v[0][2], ul, vt);
			qd.Set(1, v[1][0], v[1][1], v[1][2], ur, vt);
			qd.Set(2, v[2][0], v[2][1], v[2][2], ul, vb);
			qd.Set(3, v[3][0], v[3][1], v[3][2], ur, vb);
			qd.Render(GL_TRIANGLE_STRIP);

			if (foglayer)
			{
				// If we get here we know that we have colored fog and no fixed colormap.
				gl_SetFog(foglevel, rel, &Colormap, additivefog);
				gl_RenderState.SetFixedColormap(CM_FOGLAYER);
				gl_RenderState.BlendEquation(GL_FUNC_ADD);
				gl_RenderState.BlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
				gl_RenderState.Apply();
				qd.Render(GL_TRIANGLE_STRIP);
				gl_RenderState.SetFixedColormap(CM_DEFAULT);
			}
		}
		else
		{
			gl_RenderModel(this);
		}
	}

	if (clipping)
	{
		gl_RenderState.EnableSplit(false);
	}

	if (pass==GLPASS_TRANSLUCENT)
	{
		gl_RenderState.EnableBrightmap(true);
		gl_RenderState.BlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
		gl_RenderState.BlendEquation(GL_FUNC_ADD);
		gl_RenderState.SetTextureMode(TM_MODULATE);
	}

	gl_RenderState.SetObjectColor(0xffffffff);
	gl_RenderState.EnableTexture(true);
	gl_RenderState.SetDynLight(0,0,0);
}